

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O1

int oonf_packet_apply_managed(oonf_packet_managed *managed,oonf_packet_managed_config *config)

{
  list_entity *plVar1;
  int iVar2;
  char *__s1;
  
  __s1 = config->interface;
  iVar2 = strcmp(__s1,(managed->_managed_config).interface);
  if ((iVar2 == 0) && ((managed->_if_listener)._node.next != (list_entity *)0x0)) {
    plVar1 = (managed->_if_listener)._node.prev;
    oonf_packet_copy_managed_config(&managed->_managed_config,config);
    if (plVar1 != (list_entity *)0x0) goto LAB_00118930;
  }
  else {
    oonf_packet_copy_managed_config(&managed->_managed_config,config);
  }
  os_interface_linux_remove(&managed->_if_listener);
  (managed->_if_listener).mesh = (managed->_managed_config).mesh;
  os_interface_linux_add(&managed->_if_listener);
LAB_00118930:
  if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 1) != 0) {
    if (config->interface[0] == '\0') {
      __s1 = "any";
    }
    oonf_log(1,(ulong)_oonf_packet_socket_subsystem.logging,"src/base/oonf_packet_socket.c",0x140,0,
             0,"Apply changes for managed socket (if %s) with port %d/%d",__s1,config->port,
             config->multicast_port);
  }
  iVar2 = _apply_managed(managed);
  if (iVar2 != 0) {
    os_interface_linux_trigger_handler(&managed->_if_listener);
  }
  return iVar2;
}

Assistant:

int
oonf_packet_apply_managed(struct oonf_packet_managed *managed, const struct oonf_packet_managed_config *config) {
  bool if_changed;
  int result;

  if_changed = strcmp(config->interface, managed->_managed_config.interface) != 0 ||
               !list_is_node_added(&managed->_if_listener._node);

  oonf_packet_copy_managed_config(&managed->_managed_config, config);

  /* handle change in interface listener */
  if (if_changed) {
    /* interface changed, remove old listener if necessary */
    os_interface_remove(&managed->_if_listener);

    /* create new interface listener */
    managed->_if_listener.mesh = managed->_managed_config.mesh;
    os_interface_add(&managed->_if_listener);
  }

  OONF_DEBUG(LOG_PACKET, "Apply changes for managed socket (if %s) with port %d/%d",
    config->interface[0] == 0 ? "any" : config->interface, config->port, config->multicast_port);

  result = _apply_managed(managed);
  if (result) {
    /* did not work, trigger interface handler to try later again */
    os_interface_trigger_handler(&managed->_if_listener);
  }
  return result;
}